

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void GA_Scan_copy(int g_a,int g_b,int g_sbit,int lo,int hi)

{
  pnga_scan_copy((long)g_a,(long)g_b,(long)g_sbit,(long)(lo + 1),(long)(hi + 1));
  return;
}

Assistant:

void GA_Scan_copy(int g_a, int g_b, int g_sbit, int lo,
                  int hi)
{
     Integer a = (Integer)g_a;
     Integer b = (Integer)g_b;
     Integer s = (Integer)g_sbit;
     Integer alo = lo+1;
     Integer ahi = hi+1;
     wnga_scan_copy(a, b, s, alo, ahi);

}